

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

int dump_elem(lyout *out,lyxml_elem *e,int level,int options,int last_elem)

{
  lyxml_elem *plVar1;
  lyxml_attr *plVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  char *format;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  lyxml_attr **pplVar11;
  int iVar12;
  lyxml_elem **pplVar13;
  
  if (e->name == (char *)0x0) {
    if (e->content == (char *)0x0) {
      return 0;
    }
    iVar3 = lyxml_dump_text(out,e->content,LYXML_DATA_ELEM);
    return iVar3;
  }
  pcVar5 = "\n";
  if ((options & 2U) == 0) {
    pcVar5 = "";
  }
  uVar10 = level * 2;
  plVar1 = e->parent;
  if ((e->flags & 1U) == 0) {
    pcVar8 = pcVar5;
    if (plVar1 != (lyxml_elem *)0x0) {
      pcVar8 = "";
      if ((plVar1->flags & 1U) == 0) {
        pcVar8 = pcVar5;
      }
LAB_00121865:
      if ((plVar1->flags & 1U) != 0) {
        pcVar5 = "";
        uVar10 = 0;
      }
    }
  }
  else {
    pcVar8 = "";
    if (plVar1 != (lyxml_elem *)0x0) goto LAB_00121865;
    pcVar8 = "";
  }
  pcVar9 = "";
  if ((options & 0x20U) == 0) {
    pcVar9 = pcVar5;
  }
  if (last_elem == 0) {
    pcVar9 = pcVar5;
  }
  if ((options & 0xdU) == 0 || (options & 1U) != 0) {
    if ((e->ns == (lyxml_ns *)0x0) || (e->ns->prefix == (char *)0x0)) {
      iVar3 = ly_print(out,"%*s<%s",(ulong)uVar10,"");
    }
    else {
      iVar3 = ly_print(out,"%*s<%s:%s",(ulong)uVar10,"");
    }
LAB_0012194b:
    pplVar11 = &e->attr;
    iVar12 = iVar3;
    while (plVar2 = *pplVar11, plVar2 != (lyxml_attr *)0x0) {
      if (plVar2->type == LYXML_ATTR_NS) {
        pcVar5 = plVar2->name;
        pcVar6 = plVar2->value;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = "";
        }
        if (pcVar5 == (char *)0x0) {
          iVar3 = ly_print(out," xmlns=\"%s\"",pcVar6);
        }
        else {
          format = " xmlns:%s=\"%s\"";
LAB_001219d8:
          iVar3 = ly_print(out,format,pcVar5,pcVar6);
        }
      }
      else {
        if ((plVar2->ns == (lyxml_ns *)0x0) || (pcVar5 = plVar2->ns->prefix, pcVar5 == (char *)0x0))
        {
          pcVar5 = plVar2->name;
          pcVar6 = plVar2->value;
          format = " %s=\"%s\"";
          goto LAB_001219d8;
        }
        iVar3 = ly_print(out," %s:%s=\"%s\"",pcVar5,plVar2->name);
      }
      iVar12 = iVar12 + iVar3;
      pplVar11 = &plVar2->next;
    }
    if ((~options & 5U) != 0) {
      if ((options & 1U) != 0) {
        ly_print(out,">");
        return iVar12 + 1;
      }
      if ((options & 8U) != 0) {
        return iVar12;
      }
      pcVar5 = e->content;
      if (e->child != (lyxml_elem *)0x0) {
        if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
LAB_00121b28:
          ly_print(out,">");
          iVar3 = lyxml_dump_text(out,e->content,LYXML_DATA_ELEM);
          if ((e->ns == (lyxml_ns *)0x0) || (pcVar5 = e->ns->prefix, pcVar5 == (char *)0x0)) {
            iVar4 = ly_print(out,"</%s>%s",e->name,pcVar8);
          }
          else {
            iVar4 = ly_print(out,"</%s:%s>%s",pcVar5,e->name,pcVar8);
          }
          return iVar12 + iVar3 + 1 + iVar4;
        }
        iVar3 = ly_print(out,">%s",pcVar8);
        iVar12 = iVar3 + iVar12;
        pplVar13 = &e->child;
        while (plVar1 = *pplVar13, plVar1 != (lyxml_elem *)0x0) {
          if ((options & 2U) == 0) {
            iVar3 = 0;
            iVar4 = level;
          }
          else {
            iVar3 = 2;
            iVar4 = level + 1;
          }
          iVar3 = dump_elem(out,plVar1,iVar4,iVar3,0);
          iVar12 = iVar12 + iVar3;
          pplVar13 = &plVar1->next;
        }
        uVar7 = (ulong)uVar10;
        goto LAB_001218c3;
      }
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) goto LAB_00121b28;
    }
    iVar3 = ly_print(out,"/>%s",pcVar8);
    goto LAB_00121af2;
  }
  iVar3 = 0;
  iVar12 = 0;
  uVar7 = 0;
  if ((options & 4U) == 0) goto LAB_0012194b;
LAB_001218c3:
  if (e->ns == (lyxml_ns *)0x0) {
    pcVar5 = e->name;
LAB_00121ad4:
    pcVar8 = pcVar5;
    pcVar5 = "%*s</%s>%s";
  }
  else {
    pcVar8 = e->ns->prefix;
    pcVar5 = e->name;
    if (pcVar8 == (char *)0x0) goto LAB_00121ad4;
    pcVar5 = "%*s</%s:%s>%s";
    pcVar9 = e->name;
  }
  iVar3 = ly_print(out,pcVar5,uVar7,"",pcVar8,pcVar9);
LAB_00121af2:
  return iVar3 + iVar12;
}

Assistant:

static int
dump_elem(struct lyout *out, const struct lyxml_elem *e, int level, int options, int last_elem)
{
    int size = 0;
    struct lyxml_attr *a;
    struct lyxml_elem *child;
    const char *delim, *delim_outer;
    int indent;

    if (!e->name) {
        /* mixed content */
        if (e->content) {
            return lyxml_dump_text(out, e->content, LYXML_DATA_ELEM);
        } else {
            return 0;
        }
    }

    delim = delim_outer = (options & LYXML_PRINT_FORMAT) ? "\n" : "";
    indent = 2 * level;
    if ((e->flags & LYXML_ELEM_MIXED) || (e->parent && (e->parent->flags & LYXML_ELEM_MIXED))) {
        delim = "";
    }
    if (e->parent && (e->parent->flags & LYXML_ELEM_MIXED)) {
        delim_outer = "";
        indent = 0;
    }
    if (last_elem && (options & LYXML_PRINT_NO_LAST_NEWLINE)) {
        delim_outer = "";
    }

    if (!(options & (LYXML_PRINT_OPEN | LYXML_PRINT_CLOSE | LYXML_PRINT_ATTRS)) || (options & LYXML_PRINT_OPEN))  {
        /* opening tag */
        if (e->ns && e->ns->prefix) {
            size += ly_print(out, "%*s<%s:%s", indent, "", e->ns->prefix, e->name);
        } else {
            size += ly_print(out, "%*s<%s", indent, "", e->name);
        }
    } else if (options & LYXML_PRINT_CLOSE) {
        indent = 0;
        goto close;
    }

    /* attributes */
    for (a = e->attr; a; a = a->next) {
        if (a->type == LYXML_ATTR_NS) {
            if (a->name) {
                size += ly_print(out, " xmlns:%s=\"%s\"", a->name, a->value ? a->value : "");
            } else {
                size += ly_print(out, " xmlns=\"%s\"", a->value ? a->value : "");
            }
        } else if (a->ns && a->ns->prefix) {
            size += ly_print(out, " %s:%s=\"%s\"", a->ns->prefix, a->name, a->value);
        } else {
            size += ly_print(out, " %s=\"%s\"", a->name, a->value);
        }
    }

    /* apply options */
    if ((options & LYXML_PRINT_CLOSE) && (options & LYXML_PRINT_OPEN)) {
        size += ly_print(out, "/>%s", delim);
        return size;
    } else if (options & LYXML_PRINT_OPEN) {
        ly_print(out, ">");
        return ++size;
    } else if (options & LYXML_PRINT_ATTRS) {
        return size;
    }

    if (!e->child && (!e->content || !e->content[0])) {
        size += ly_print(out, "/>%s", delim);
        return size;
    } else if (e->content && e->content[0]) {
        ly_print(out, ">");
        size++;

        size += lyxml_dump_text(out, e->content, LYXML_DATA_ELEM);

        if (e->ns && e->ns->prefix) {
            size += ly_print(out, "</%s:%s>%s", e->ns->prefix, e->name, delim);
        } else {
            size += ly_print(out, "</%s>%s", e->name, delim);
        }
        return size;
    } else {
        size += ly_print(out, ">%s", delim);
    }

    /* go recursively */
    LY_TREE_FOR(e->child, child) {
        if (options & LYXML_PRINT_FORMAT) {
            size += dump_elem(out, child, level + 1, LYXML_PRINT_FORMAT, 0);
        } else {
            size += dump_elem(out, child, level, 0, 0);
        }
    }

close:
    /* closing tag */
    if (e->ns && e->ns->prefix) {
        size += ly_print(out, "%*s</%s:%s>%s", indent, "", e->ns->prefix, e->name, delim_outer);
    } else {
        size += ly_print(out, "%*s</%s>%s", indent, "", e->name, delim_outer);
    }

    return size;
}